

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
* __thiscall
google::protobuf::Map<int,std::__cxx11::string>::TryEmplaceInternal<int,std::__cxx11::string>
          (pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *k,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  bool bVar1;
  NodeBase *node;
  map_index_t b;
  ulong uVar2;
  long lVar3;
  NodeAndBucket NVar4;
  
  NVar4 = protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
                    ((KeyMapBase<unsigned_int> *)this,*k);
  node = NVar4.node;
  b = NVar4.bucket;
  if (node == (NodeBase *)0x0) {
    bVar1 = protobuf::internal::KeyMapBase<unsigned_int>::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<unsigned_int> *)this,(ulong)(*this + 1));
    if (bVar1) {
      uVar2 = ((ulong)(uint)*k ^ (ulong)&absl::lts_20250127::hash_internal::MixingHashState::kSeed)
              * -0x234dd359734ecb13;
      uVar2 = ((uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
               uVar2 << 0x38) ^ *(ulong *)((long)this + 0x10)) * -0x234dd359734ecb13;
      lVar3 = ((uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
               uVar2 << 0x38) ^ *(ulong *)((long)this + 0x10)) * -0x234dd359734ecb13;
      b = ((uint)(byte)((ulong)lVar3 >> 0x38) | ((uint)((ulong)lVar3 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar3 >> 0x18) & 0xff0000 | (uint)((ulong)lVar3 >> 8) & 0xff000000) &
          *(int *)((long)this + 4) - 1U;
    }
    node = protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
    *(int *)&node[1].next = *k;
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node + 2),
               *(Arena **)((long)this + 0x18),args);
    protobuf::internal::KeyMapBase<unsigned_int>::InsertUnique
              ((KeyMapBase<unsigned_int> *)this,b,(KeyNode *)node);
    *(int *)this = *this + 1;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = node;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = b;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }